

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sattrack.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  undefined1 local_538 [8];
  CoordGeodetic geo;
  CoordTopocentric topo;
  Eci eci;
  DateTime local_4b0;
  DateTime dt;
  undefined1 local_4a0 [4];
  int i;
  SGP4 sgp4;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  Tle tle;
  Observer obs;
  
  libsgp4::Observer::Observer
            ((Observer *)&tle.norad_number_,51.507406923983446,-0.12773752212524414,0.05);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"UK-DMC 2                ",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "1 35683U 09041C   12289.23158813  .00000484  00000-0  89219-4 0  5863",&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,
             "2 35683  98.0221 185.3682 0001499 100.5295 259.6088 14.69819587172294",
             (allocator<char> *)&sgp4.field_0x2cf);
  libsgp4::Tle::Tle((Tle *)local_148,&local_168,&local_1a0,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&sgp4.field_0x2cf);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  libsgp4::SGP4::SGP4((SGP4 *)local_4a0,(Tle *)local_148);
  poVar1 = libsgp4::operator<<((ostream *)&std::cout,(Tle *)local_148);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (dt.m_encoded._4_4_ = 0; dt.m_encoded._4_4_ < 10; dt.m_encoded._4_4_ = dt.m_encoded._4_4_ + 1)
  {
    eci.m_velocity.w = (double)libsgp4::Tle::Epoch((Tle *)local_148);
    local_4b0 = libsgp4::DateTime::AddMinutes
                          ((DateTime *)&eci.m_velocity.w,(double)(dt.m_encoded._4_4_ * 10));
    libsgp4::SGP4::FindPosition((Eci *)&topo.range_rate,(SGP4 *)local_4a0,&local_4b0);
    libsgp4::Observer::GetLookAngle
              ((CoordTopocentric *)&geo.altitude,(Observer *)&tle.norad_number_,
               (Eci *)&topo.range_rate);
    libsgp4::Eci::ToGeodetic((CoordGeodetic *)local_538,(Eci *)&topo.range_rate);
    poVar1 = libsgp4::operator<<((ostream *)&std::cout,&local_4b0);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = libsgp4::operator<<(poVar1,(CoordTopocentric *)&geo.altitude);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = libsgp4::operator<<(poVar1,(CoordGeodetic *)local_538);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  libsgp4::Tle::~Tle((Tle *)local_148);
  return 0;
}

Assistant:

int main()
{
    libsgp4::Observer obs(51.507406923983446, -0.12773752212524414, 0.05);
    libsgp4::Tle tle = libsgp4::Tle("UK-DMC 2                ",
        "1 35683U 09041C   12289.23158813  .00000484  00000-0  89219-4 0  5863",
        "2 35683  98.0221 185.3682 0001499 100.5295 259.6088 14.69819587172294");
    libsgp4::SGP4 sgp4(tle);

    std::cout << tle << std::endl;

    for (int i = 0; i < 10; ++i)
    {
        libsgp4::DateTime dt = tle.Epoch().AddMinutes(i * 10);
        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(dt);
        /*
         * get look angle for observer to satellite
         */
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);
        /*
         * convert satellite position to geodetic coordinates
         */
        libsgp4::CoordGeodetic geo = eci.ToGeodetic();

        std::cout << dt << " " << topo << " " << geo << std::endl;
    };

    return 0;
}